

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
* __thiscall
enact::cloneAll<enact::Typename_const>
          (vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
           *__return_storage_ptr__,enact *this,
          vector<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
          *cloneables)

{
  undefined8 *puVar1;
  pointer *__ptr;
  undefined8 *puVar2;
  _Head_base<0UL,_const_enact::Typename_*,_false> local_38;
  _Head_base<0UL,_const_enact::Typename_*,_false> local_30;
  
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>,_std::allocator<std::unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar1 = *(undefined8 **)(this + 8);
  for (puVar2 = *(undefined8 **)this; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    (**(code **)(*(long *)*puVar2 + 0x10))(&local_30);
    local_38._M_head_impl = local_30._M_head_impl;
    local_30._M_head_impl = (Typename *)0x0;
    std::
    vector<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::allocator<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>>
    ::
    emplace_back<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>
              ((vector<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>,std::allocator<std::unique_ptr<enact::Typename_const,std::default_delete<enact::Typename_const>>>>
                *)__return_storage_ptr__,
               (unique_ptr<const_enact::Typename,_std::default_delete<const_enact::Typename>_> *)
               &local_38);
    if (local_38._M_head_impl != (Typename *)0x0) {
      (*(local_38._M_head_impl)->_vptr_Typename[1])();
    }
    local_38._M_head_impl = (Typename *)0x0;
    if (local_30._M_head_impl != (Typename *)0x0) {
      (*(local_30._M_head_impl)->_vptr_Typename[1])();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<std::unique_ptr<Cloneable>> cloneAll(const std::vector<std::unique_ptr<Cloneable>>& cloneables) {
        std::vector<std::unique_ptr<Cloneable>> cloned;
        for (const std::unique_ptr<Cloneable>& cloneable : cloneables) {
            cloned.push_back(cloneable->clone());
        }
        return cloned;
    }